

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O2

void __thiscall cinatra::http_parser::parse_query(http_parser *this,string_view str)

{
  size_type __n;
  size_type sVar1;
  pointer pbVar2;
  string_view delimiter;
  basic_string_view<char,_std::char_traits<char>_> s;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  vec;
  
  local_68 = (basic_string_view<char,_std::char_traits<char>_>)ZEXT816(0);
  local_58 = (basic_string_view<char,_std::char_traits<char>_>)ZEXT816(0);
  delimiter._M_str = "&";
  delimiter._M_len = 1;
  split_sv(&vec,str,delimiter);
  pbVar2 = vec.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar2 == vec.
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~_Vector_base(&vec.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     );
      return;
    }
    s._M_len = pbVar2->_M_len;
    s._M_str = pbVar2->_M_str;
    if (s._M_len != 0) {
      __n = std::basic_string_view<char,_std::char_traits<char>_>::find(&s,'=',0);
      sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find(&s,'=',0);
      if (sVar1 == 0xffffffffffffffff) {
        local_68._M_str._0_4_ = s._M_str._0_4_;
        local_68._M_len = s._M_len;
        local_68._M_str._4_4_ = s._M_str._4_4_;
        local_58 = (basic_string_view<char,_std::char_traits<char>_>)(ZEXT816(0x16fe8f) << 0x40);
      }
      else {
        local_68 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&s,0,__n);
        if (local_68._M_len == 0) goto LAB_00143cb9;
        local_58 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             (&s,__n + 1,s._M_len - __n);
      }
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_emplace<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&this->queries_,&local_68,&local_58);
    }
LAB_00143cb9:
    pbVar2 = pbVar2 + 1;
  } while( true );
}

Assistant:

void parse_query(std::string_view str) {
    std::string_view key;
    std::string_view val;

    auto vec = split_sv(str, "&");
    for (auto s : vec) {
      if (s.empty()) {
        continue;
      }
      size_t pos = s.find('=');
      if (s.find('=') != std::string_view::npos) {
        key = s.substr(0, pos);
        if (key.empty()) {
          continue;
        }
        val = s.substr(pos + 1, s.length() - pos);
      }
      else {
        key = s;
        val = "";
      }
      queries_.emplace(key, val);
    }
  }